

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O0

size_t arith_decompress(uint32_t *obuff,size_t osize,uint8_t *ibuff,size_t isize)

{
  value_type vVar1;
  size_t sVar2;
  size_t sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_t sVar5;
  reference pvVar6;
  ulong uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  ulong uVar9;
  ostream *this;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  uint32_t *in_RSI;
  long in_RDI;
  int hi;
  int lo;
  vector<unsigned_int,_std::allocator<unsigned_int>_> F;
  size_t nunq;
  size_t maxv;
  uint64_t v;
  uint64_t target;
  uint64_t scale;
  uint64_t total;
  uint64_t high;
  uint64_t low;
  uint64_t D;
  uint64_t R;
  size_t ip;
  size_t op;
  int i;
  allocator_type *in_stack_fffffffffffffef8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff10;
  uint64_t max;
  uint64_t *v_00;
  int local_bc;
  int local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  uint32_t *isize_00;
  size_type osize_00;
  uint32_t *in_stack_ffffffffffffff90;
  uint32_t *obuff_00;
  ulong local_48;
  ulong local_40;
  uint8_t *local_38;
  uint32_t *local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar11;
  
  local_40 = 0xffffffffffffff;
  osize_00 = 0;
  max = 0x80000000;
  v_00 = (uint64_t *)&stack0xffffffffffffff90;
  sVar2 = byte_decode(in_RDX,(size_t)in_RCX,0x80000000,v_00);
  isize_00 = in_stack_ffffffffffffff90;
  sVar3 = byte_decode(in_RDX + sVar2,(long)in_RCX - sVar2,max,v_00);
  iVar11 = (int)(max >> 0x20);
  pvVar4 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           ((long)in_stack_ffffffffffffff90 + 1);
  obuff_00 = isize_00;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17872b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
             ,(value_type *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x178750);
  if (isize_00 < (uint32_t *)0x3e8) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17876c);
    sVar5 = interp_decompress(obuff_00,osize_00,(uint8_t *)in_stack_ffffffffffffff90,
                              (size_t)isize_00);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x178802);
    sVar5 = arith_decompress(in_RSI,(size_t)in_RDX,in_RCX,
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  local_38 = (uint8_t *)(sVar5 + sVar2 + sVar3);
  pvVar4 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           scale_counts(pvVar4,(size_t)v_00,iVar11);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_a0,0);
  *pvVar6 = 0;
  for (iVar11 = 1; (uint32_t *)(long)iVar11 <= in_stack_ffffffffffffff90; iVar11 = iVar11 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_a0,(long)(iVar11 + -1));
    vVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_a0,(long)iVar11);
    vVar1 = vVar1 + *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_a0,(long)iVar11);
    *pvVar6 = vVar1;
  }
  local_48 = 0;
  for (iVar11 = 0; iVar11 < 7; iVar11 = iVar11 + 1) {
    local_48 = (ulong)in_RDX[(long)local_38] + local_48 * 0x100;
    local_38 = local_38 + 1;
  }
  local_30 = (uint32_t *)0x0;
  do {
    if (in_RSI <= local_30) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff00);
      return (size_t)local_38;
    }
    uVar7 = local_40 >> 0x1f;
    pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_48 / uVar7);
    if (pvVar4 <= pvVar8) {
      pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&pvVar4[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    }
    local_b8 = 0;
    local_bc = (int)in_stack_ffffffffffffff90;
    pvVar10 = in_stack_ffffffffffffff00;
    while (in_stack_ffffffffffffff00 = pvVar10, local_b8 < local_bc) {
      osize_00 = (size_type)(local_b8 + 1 + local_bc >> 1);
      in_stack_ffffffffffffff00 = pvVar8;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_a0,osize_00 - 1);
      pvVar8 = in_stack_ffffffffffffff00;
      if (in_stack_ffffffffffffff00 <
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)*pvVar6) {
        local_bc = (int)osize_00;
      }
      else {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_a0,osize_00);
        if (in_stack_ffffffffffffff00 <
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)*pvVar6) break;
        local_b8 = (int)osize_00;
        pvVar10 = in_stack_ffffffffffffff00;
      }
    }
    *(int *)(in_RDI + (long)local_30 * 4) = (int)osize_00 + -1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_a0,osize_00 - 1);
    uVar9 = (ulong)*pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_a0,osize_00);
    local_48 = local_48 - uVar9 * uVar7;
    if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)*pvVar6 < pvVar4) {
      local_40 = ((long)(ulong)*pvVar6 - uVar9) * uVar7;
    }
    else {
      local_40 = local_40 - uVar9 * uVar7;
    }
    for (; local_40 < 0x1000000000000; local_40 = local_40 << 8) {
      if (in_RCX <= local_38) {
        this = std::operator<<((ostream *)&std::cerr,"I/O error");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      local_48 = (ulong)in_RDX[(long)local_38] + (local_48 & 0xffffffffffff) * 0x100;
      local_38 = local_38 + 1;
    }
    local_30 = (uint32_t *)((long)local_30 + 1);
  } while( true );
}

Assistant:

size_t arith_decompress(uint32_t* obuff, /* output buffer */
    size_t osize, /* number symbols to be decoded */
    const uint8_t* ibuff, /* input buffer */
    size_t isize)
{ /* size of input buffer */

    int i;
    size_t op, ip = 0;

    /* state variables for decoding */
    uint64_t R = FULL;
    uint64_t D;
    uint64_t low, high, total, scale;
    uint64_t target;
    uint64_t v = 0;
    size_t maxv;
    size_t nunq;

    /* fetch the prelude */
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 31), &target);
    maxv = target;
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 31), &target);
    nunq = target;

    std::vector<uint32_t> F(maxv + 1, 0);

    if (nunq < PREL_RECURSE) {
        /* small enough that inefficient approach is ok */
        ip += interp_decompress(F.data(), maxv + 1, ibuff + ip, isize - ip);
    } else {
        /* or else, tadaa, recursive call for prelude... */
        ip += arith_decompress(F.data(), maxv + 1, ibuff + ip, isize - ip);
    }

    /* adjust and scale the counts like the encoder did */
    total = scale_counts(F, maxv, 1);

    /* convert to cumulative sums */
    F[0] = 0;
    for (i = 1; i <= maxv; i++) {
        F[i] = F[i - 1] + F[i];
    }

    /* load up D */
    D = 0;
    for (i = 0; i < BBYTES; i++) {
        D <<= 8;
        D += ibuff[ip++];
    }

    /* and decode the required symbols one by one */
    for (op = 0; op < osize; op++) {
        /* decode target */
        scale = R >> TBTS;
        target = D / scale;

        /* beware of the rounding that might accrue at the top of the
                   range, and adjust downward if required */
        if (target >= total)
            target = total - 1;
        /* binary search in F for target is a little faster */
        {
            int lo = 0, hi = maxv;
            /* elements F[lo..hi] inclusive being considered */
            while (lo < hi) {
                v = (1 + lo + hi) >> 1;
                if (F[v - 1] > target) {
                    hi = v;
                } else if (target >= F[v]) {
                    lo = v;
                } else {
                    break;
                }
            }
        }

        /* (could also take leading bits of target to index a table
                   and accelerate the search, leave that for another day)
                */
        obuff[op] = v - 1;

        /* adjust, tracing the encoder, with D=V-L throughout */
        low = F[v - 1];
        high = F[v];
        D -= low * scale;
        if (high < total) {
            R = (high - low) * scale;
        } else {
            R = R - low * scale;
        }

        while (R < PART) {
            if (ip >= isize) {
                std::cerr << "I/O error" << std::endl;
                exit(EXIT_FAILURE);
            }
            /* range has shrunk, time to bring in another byte */
            R <<= 8;
            D <<= 8;
            D &= FULL;
            D += ibuff[ip++];
        }
    }
    return ip;
}